

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ViewportArrayTestInstance>::createInstance
          (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ViewportArrayTestInstance>
           *this,Context *context)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  char *vertexShaderName;
  DynamicStateBaseClass *pDVar1;
  mapped_type *ppcVar2;
  VkPhysicalDeviceFeatures *pVVar3;
  NotSupportedError *pNVar4;
  int i;
  int iVar5;
  float fVar6;
  RGBA local_a4;
  DynamicStateBaseClass *local_a0;
  undefined1 local_98 [12];
  float local_8c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  DynamicStateBaseClass *local_78;
  float local_70;
  float fStack_6c;
  float afStack_68 [2];
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_60;
  
  pDVar1 = (DynamicStateBaseClass *)operator_new(0x1c8);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_60,&(this->m_shaderPaths)._M_t);
  local_98._0_4_ = 0.0;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_60,(key_type *)local_98);
  vertexShaderName = *ppcVar2;
  local_70 = 1.4013e-45;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_60,(key_type *)&local_70);
  DynamicStateBaseClass::DynamicStateBaseClass(pDVar1,context,vertexShaderName,*ppcVar2);
  (pDVar1->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ViewportArrayTestInstance_00d2fef8;
  local_98._0_4_ = 2.8026e-45;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_60,(key_type *)local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(pDVar1 + 1),*ppcVar2,(allocator<char> *)&local_70);
  pVVar3 = Context::getDeviceFeatures((pDVar1->super_TestInstance).m_context);
  if (pVVar3->multiViewport == 0) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Multi-viewport is not supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_98);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_a0 = pDVar1;
  if (pVVar3->geometryShader != 0) {
    this_00 = &pDVar1->m_data;
    iVar5 = 0;
    local_78 = pDVar1;
    do {
      fVar6 = (float)iVar5 / 3.0;
      local_a4.m_value = 0xff00ff00;
      tcu::RGBA::toVec(&local_a4);
      local_98._0_8_ = (pointer)0x3f800000bf800000;
      local_8c = 1.0;
      local_88._M_allocated_capacity = CONCAT44(fStack_6c,local_70);
      local_88._8_4_ = afStack_68[0];
      local_88._12_4_ = afStack_68[1];
      local_98._8_4_ = fVar6;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_00,(PositionColorVertex *)local_98);
      local_a4.m_value = 0xff00ff00;
      tcu::RGBA::toVec(&local_a4);
      local_98._0_8_ = (pointer)0x3f8000003f800000;
      local_8c = 1.0;
      local_88._M_allocated_capacity = CONCAT44(fStack_6c,local_70);
      local_88._8_4_ = afStack_68[0];
      local_88._12_4_ = afStack_68[1];
      local_98._8_4_ = fVar6;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_00,(PositionColorVertex *)local_98);
      local_a4.m_value = 0xff00ff00;
      tcu::RGBA::toVec(&local_a4);
      local_98._0_8_ = (pointer)0xbf800000bf800000;
      local_8c = 1.0;
      local_88._M_allocated_capacity = CONCAT44(fStack_6c,local_70);
      local_88._8_4_ = afStack_68[0];
      local_88._12_4_ = afStack_68[1];
      local_98._8_4_ = fVar6;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_00,(PositionColorVertex *)local_98);
      local_a4.m_value = 0xff00ff00;
      tcu::RGBA::toVec(&local_a4);
      local_98._0_8_ = (pointer)0xbf8000003f800000;
      local_8c = 1.0;
      local_88._M_allocated_capacity = CONCAT44(fStack_6c,local_70);
      local_88._8_4_ = afStack_68[0];
      local_88._12_4_ = afStack_68[1];
      local_98._8_4_ = fVar6;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_00,(PositionColorVertex *)local_98);
      pDVar1 = local_a0;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 4);
    DynamicStateBaseClass::initialize(local_a0);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree(&local_60);
    return &pDVar1->super_TestInstance;
  }
  pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_98._0_8_ = &local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Geometry shaders are not supported","");
  tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_98);
  __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}